

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O0

uint32_t loader::anon_unknown_0::pe_reader::find_resource_entry(istream *is,uint32_t id)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint in_ESI;
  long in_RDI;
  uint32_t entry_offset;
  uint32_t entry_id;
  size_t i;
  uint32_t entry_size;
  uint32_t offset;
  uint16_t nbids;
  uint16_t nbnames;
  uint local_34;
  ulong local_28;
  uint local_4;
  
  std::istream::seekg(in_RDI,0xc);
  uVar5 = std::ios::fail();
  if ((uVar5 & 1) == 0) {
    uVar1 = util::load<unsigned_short>((istream *)0x1697ad);
    uVar2 = util::load<unsigned_short>((istream *)0x1697bc);
    if (in_ESI == 0xffffffff) {
      std::istream::seekg(in_RDI,4);
      local_34 = util::load<unsigned_int>((istream *)0x1697e4);
      uVar5 = std::ios::fail();
      if ((uVar5 & 1) != 0) {
        local_34 = 0;
      }
      local_4 = local_34;
    }
    else {
      std::istream::seekg(in_RDI,(uint)uVar1 << 3);
      uVar5 = std::ios::fail();
      if ((uVar5 & 1) == 0) {
        for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
          uVar3 = util::load<unsigned_int>((istream *)0x169883);
          uVar4 = util::load<unsigned_int>((istream *)0x169891);
          uVar5 = std::ios::fail();
          if ((uVar5 & 1) != 0) {
            return 0;
          }
          if (uVar3 == in_ESI) {
            return uVar4;
          }
        }
        local_4 = 0;
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

boost::uint32_t pe_reader::find_resource_entry(std::istream & is, boost::uint32_t id) {
	
	// skip: characteristics + timestamp + major version + minor version
	if(is.seekg(4 + 4 + 2 + 2, std::ios_base::cur).fail()) {
		return 0;
	}
	
	// Number of named resource entries.
	boost::uint16_t nbnames = util::load<boost::uint16_t>(is);
	
	// Number of id resource entries.
	boost::uint16_t nbids = util::load<boost::uint16_t>(is);
	
	if(id == Default) {
		boost::uint32_t offset = util::load<boost::uint32_t>(is.seekg(4, std::ios_base::cur));
		return is.fail() ? 0 : offset;
	}
	
	// Ignore named resource entries.
	const boost::uint32_t entry_size = 4 + 4; // id / string address + offset
	if(is.seekg(nbnames * entry_size, std::ios_base::cur).fail()) {
		return 0;
	}
	
	for(size_t i = 0; i < nbids; i++) {
		
		boost::uint32_t entry_id = util::load<boost::uint32_t>(is);
		boost::uint32_t entry_offset = util::load<boost::uint32_t>(is);
		if(is.fail()) {
			return 0;
		}
		
		if(entry_id == id) {
			return entry_offset;
		}
		
	}
	
	return 0;
}